

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderIR *this,Index segment_index,Index func_index)

{
  Index index;
  size_type sVar1;
  reference ppEVar2;
  ElemExprVector *this_00;
  Location local_90;
  Var local_70;
  value_type local_28;
  ElemSegment *segment;
  Index func_index_local;
  Index segment_index_local;
  BinaryReaderIR *this_local;
  
  segment._0_4_ = func_index;
  segment._4_4_ = segment_index;
  _func_index_local = this;
  sVar1 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::size
                    (&this->module_->elem_segments);
  if ((ulong)segment_index == sVar1 - 1) {
    ppEVar2 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::operator[]
                        (&this->module_->elem_segments,(ulong)segment._4_4_);
    index = (Index)segment;
    local_28 = *ppEVar2;
    this_00 = &local_28->elem_exprs;
    GetLocation(&local_90,this);
    Var::Var(&local_70,index,&local_90);
    std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::emplace_back<wabt::Var>
              (this_00,&local_70);
    Var::~Var(&local_70);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    return (Result)this_local._4_4_;
  }
  __assert_fail("segment_index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-reader-ir.cc"
                ,0x43a,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                     Index func_index) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  segment->elem_exprs.emplace_back(Var(func_index, GetLocation()));
  return Result::Ok;
}